

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EscapeCodeGenerator.hpp
# Opt level: O0

EscapeCode * __thiscall
yb::ANSIEscapeCodeGenerator::cursorDown_abi_cxx11_
          (EscapeCode *__return_storage_ptr__,ANSIEscapeCodeGenerator *this,uint n)

{
  bool local_72;
  allocator<char> local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_1d;
  uint local_1c;
  ANSIEscapeCodeGenerator *pAStack_18;
  uint n_local;
  ANSIEscapeCodeGenerator *this_local;
  
  local_1c = n;
  pAStack_18 = this;
  this_local = (ANSIEscapeCodeGenerator *)__return_storage_ptr__;
  if (n == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else {
    if (n != 1) {
      std::__cxx11::to_string(&local_70,n);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    }
    local_72 = n == 1;
    std::operator+(&local_50,&this->EscapeCodeStart,&local_70);
    std::operator+(__return_storage_ptr__,&local_50,'B');
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_72) {
      std::allocator<char>::~allocator(&local_71);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EscapeCode cursorDown(unsigned int n) const override {
        if (!n) return "";
        return EscapeCodeStart + (n == 1 ? "" : std::to_string(n)) + 'B';
    }